

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExternalMakefileProjectGenerator.cxx
# Opt level: O0

string * cmExternalMakefileProjectGenerator::CreateFullGeneratorName
                   (string *__return_storage_ptr__,string *globalGenerator,string *extraGenerator)

{
  ulong uVar1;
  string *extraGenerator_local;
  string *globalGenerator_local;
  
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    uVar1 = std::__cxx11::string::empty();
    if ((uVar1 & 1) == 0) {
      cmStrCat<std::__cxx11::string_const&,char_const(&)[4],std::__cxx11::string_const&>
                (__return_storage_ptr__,extraGenerator,(char (*) [4])0x100a417,globalGenerator);
    }
    else {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)globalGenerator);
    }
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmExternalMakefileProjectGenerator::CreateFullGeneratorName(
  const std::string& globalGenerator, const std::string& extraGenerator)
{
  if (globalGenerator.empty()) {
    return {};
  }
  if (extraGenerator.empty()) {
    return globalGenerator;
  }
  return cmStrCat(extraGenerator, " - ", globalGenerator);
}